

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_sampler(VkSamplerCreateInfo *sampler,Hash *out_hash)

{
  bool bVar1;
  Hash HVar2;
  VkSamplerCreateFlagBits ignore_capture_replay_flags;
  Hasher h;
  Hash *out_hash_local;
  VkSamplerCreateInfo *sampler_local;
  
  h.h = (Hash)out_hash;
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd8);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->flags & 0xfffffff7);
  Hasher::f32((Hasher *)&stack0xffffffffffffffd8,sampler->maxAnisotropy);
  Hasher::f32((Hasher *)&stack0xffffffffffffffd8,sampler->mipLodBias);
  Hasher::f32((Hasher *)&stack0xffffffffffffffd8,sampler->minLod);
  Hasher::f32((Hasher *)&stack0xffffffffffffffd8,sampler->maxLod);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->minFilter);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->magFilter);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->mipmapMode);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->compareEnable);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->compareOp);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->anisotropyEnable);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->addressModeU);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->addressModeV);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->addressModeW);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->borderColor);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd8,sampler->unnormalizedCoordinates);
  bVar1 = hash_pnext_chain((StateRecorder *)0x0,(Hasher *)&stack0xffffffffffffffd8,sampler->pNext,
                           (DynamicStateInfo *)0x0,0);
  if (bVar1) {
    HVar2 = Hasher::get((Hasher *)&stack0xffffffffffffffd8);
    *(Hash *)h.h = HVar2;
  }
  return bVar1;
}

Assistant:

bool compute_hash_sampler(const VkSamplerCreateInfo &sampler, Hash *out_hash)
{
	Hasher h;

	constexpr VkSamplerCreateFlagBits ignore_capture_replay_flags =
			VK_SAMPLER_CREATE_DESCRIPTOR_BUFFER_CAPTURE_REPLAY_BIT_EXT;

	h.u32(sampler.flags & ~ignore_capture_replay_flags);
	h.f32(sampler.maxAnisotropy);
	h.f32(sampler.mipLodBias);
	h.f32(sampler.minLod);
	h.f32(sampler.maxLod);
	h.u32(sampler.minFilter);
	h.u32(sampler.magFilter);
	h.u32(sampler.mipmapMode);
	h.u32(sampler.compareEnable);
	h.u32(sampler.compareOp);
	h.u32(sampler.anisotropyEnable);
	h.u32(sampler.addressModeU);
	h.u32(sampler.addressModeV);
	h.u32(sampler.addressModeW);
	h.u32(sampler.borderColor);
	h.u32(sampler.unnormalizedCoordinates);

	if (!hash_pnext_chain(nullptr, h, sampler.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}